

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator&(sc_signed *__return_storage_ptr__,long u,sc_signed *v)

{
  unsigned_long v_00;
  sc_digit ud [3];
  
  if ((u == 0) || (v->sgn == 0)) {
    sc_length_param::sc_length_param((sc_length_param *)ud);
    sc_signed::sc_signed(__return_storage_ptr__,ud[0]);
  }
  else {
    v_00 = -u;
    if ((ulong)u < 0x8000000000000001) {
      v_00 = 0x8000000000000000;
    }
    if (0 < u) {
      v_00 = u;
    }
    from_uint<unsigned_long>(3,ud,v_00);
    and_signed_friend(__return_storage_ptr__,(uint)(0 < u) * 2 + -1,0x40,3,ud,v->sgn,v->nbits,
                      v->ndigits,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator&(long u, const sc_signed& v)
{

  if ((u == 0) || (v.sgn == SC_ZERO)) // case 1
    return sc_signed();

  CONVERT_LONG(u);

  // other cases
  return and_signed_friend(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}